

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Read<short>(KDataStream *this,short *T)

{
  reference pvVar1;
  byte local_1b;
  short local_1a;
  KUINT8 i;
  short *psStack_18;
  NetToDataType<short> OctArray;
  short *T_local;
  KDataStream *this_local;
  
  psStack_18 = T;
  T_local = (short *)this;
  NetToDataType<short>::NetToDataType((NetToDataType<short> *)&local_1a,*T,false);
  local_1b = 0;
  while (local_1b < 2) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_vBuffer,(ulong)this->m_ui16CurrentWritePos);
    *(value_type *)((long)&local_1a + (ulong)local_1b) = *pvVar1;
    local_1b = local_1b + 1;
    this->m_ui16CurrentWritePos = this->m_ui16CurrentWritePos + 1;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<short>::SwapBytes((NetToDataType<short> *)&local_1a);
  }
  *psStack_18 = local_1a;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}